

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

btStridingMeshInterfaceData * __thiscall
btCollisionWorldImporter::createStridingMeshInterfaceData
          (btCollisionWorldImporter *this,btStridingMeshInterfaceData *interfaceData)

{
  int iVar1;
  int iVar2;
  btMeshPartData *pbVar3;
  btStridingMeshInterfaceData **ptr;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  btStridingMeshInterfaceData *pbVar7;
  ulong uVar8;
  btMeshPartData *pbVar9;
  void *pvVar10;
  btStridingMeshInterfaceData **ppbVar11;
  int iVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  
  pbVar7 = (btStridingMeshInterfaceData *)operator_new(0x20);
  uVar6 = *(undefined8 *)((interfaceData->m_scaling).m_floats + 2);
  *(undefined8 *)(pbVar7->m_scaling).m_floats = *(undefined8 *)(interfaceData->m_scaling).m_floats;
  *(undefined8 *)((pbVar7->m_scaling).m_floats + 2) = uVar6;
  uVar16 = (ulong)interfaceData->m_numMeshParts;
  pbVar7->m_numMeshParts = interfaceData->m_numMeshParts;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar16;
  uVar8 = SUB168(auVar5 * ZEXT816(0x38),0);
  if (SUB168(auVar5 * ZEXT816(0x38),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pbVar9 = (btMeshPartData *)operator_new__(uVar8);
  pbVar7->m_meshPartsPtr = pbVar9;
  if (0 < (long)uVar16) {
    pbVar3 = interfaceData->m_meshPartsPtr;
    lVar13 = 0;
    do {
      iVar1 = *(int *)((long)&pbVar3->m_numTriangles + lVar13);
      lVar17 = (long)iVar1;
      *(int *)((long)&pbVar9->m_numTriangles + lVar13) = iVar1;
      iVar2 = *(int *)((long)&pbVar3->m_numVertices + lVar13);
      *(int *)((long)&pbVar9->m_numVertices + lVar13) = iVar2;
      if (*(long *)((long)&pbVar3->m_vertices3f + lVar13) == 0) {
        *(undefined8 *)((long)&pbVar9->m_vertices3f + lVar13) = 0;
      }
      else {
        sVar15 = (long)iVar2 << 4;
        sVar14 = sVar15;
        if (iVar2 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pbVar9->m_vertices3f + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pbVar3->m_vertices3f + lVar13),sVar15);
      }
      if (*(long *)((long)&pbVar3->m_vertices3d + lVar13) == 0) {
        *(undefined8 *)((long)&pbVar9->m_vertices3d + lVar13) = 0;
      }
      else {
        sVar15 = (long)iVar2 << 5;
        sVar14 = sVar15;
        if (iVar2 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pbVar9->m_vertices3d + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pbVar3->m_vertices3d + lVar13),sVar15);
      }
      bVar18 = *(long *)((long)&pbVar3->m_indices32 + lVar13) == 0;
      bVar4 = !bVar18;
      if (bVar18) {
        *(undefined8 *)((long)&pbVar9->m_indices32 + lVar13) = 0;
      }
      else {
        sVar14 = lVar17 * 0xc;
        if (iVar1 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pbVar9->m_indices32 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pbVar3->m_indices32 + lVar13),lVar17 * 0xc);
      }
      if (*(long *)((long)&pbVar3->m_3indices16 + lVar13) == 0) {
        *(undefined8 *)((long)&pbVar9->m_3indices16 + lVar13) = 0;
      }
      else {
        sVar14 = lVar17 * 8;
        if (iVar1 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pbVar9->m_3indices16 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pbVar3->m_3indices16 + lVar13),lVar17 * 8);
        bVar4 = true;
      }
      if (*(long *)((long)&pbVar3->m_indices16 + lVar13) == 0) {
        *(undefined8 *)((long)&pbVar9->m_indices16 + lVar13) = 0;
        if ((bVar4) || (*(long *)((long)&pbVar3->m_3indices8 + lVar13) == 0)) goto LAB_001499a3;
        sVar14 = lVar17 << 2;
        if (iVar1 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pbVar9->m_3indices8 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pbVar3->m_3indices8 + lVar13),lVar17 << 2);
      }
      else {
        sVar15 = (long)(iVar1 * 3) << 2;
        sVar14 = sVar15;
        if (iVar1 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pbVar9->m_indices16 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pbVar3->m_indices16 + lVar13),sVar15);
LAB_001499a3:
        *(undefined8 *)((long)&pbVar9->m_3indices8 + lVar13) = 0;
      }
      lVar13 = lVar13 + 0x38;
    } while (uVar16 * 0x38 != lVar13);
  }
  iVar1 = (this->m_allocatedbtStridingMeshInterfaceDatas).m_size;
  iVar2 = (this->m_allocatedbtStridingMeshInterfaceDatas).m_capacity;
  if (iVar1 == iVar2) {
    iVar12 = 1;
    if (iVar1 != 0) {
      iVar12 = iVar1 * 2;
    }
    if (iVar2 < iVar12) {
      if (iVar12 == 0) {
        ppbVar11 = (btStridingMeshInterfaceData **)0x0;
      }
      else {
        ppbVar11 = (btStridingMeshInterfaceData **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
      }
      lVar13 = (long)(this->m_allocatedbtStridingMeshInterfaceDatas).m_size;
      if (0 < lVar13) {
        lVar17 = 0;
        do {
          ppbVar11[lVar17] = (this->m_allocatedbtStridingMeshInterfaceDatas).m_data[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar13 != lVar17);
      }
      ptr = (this->m_allocatedbtStridingMeshInterfaceDatas).m_data;
      if (ptr != (btStridingMeshInterfaceData **)0x0) {
        if ((this->m_allocatedbtStridingMeshInterfaceDatas).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_allocatedbtStridingMeshInterfaceDatas).m_data = (btStridingMeshInterfaceData **)0x0
        ;
      }
      (this->m_allocatedbtStridingMeshInterfaceDatas).m_ownsMemory = true;
      (this->m_allocatedbtStridingMeshInterfaceDatas).m_data = ppbVar11;
      (this->m_allocatedbtStridingMeshInterfaceDatas).m_capacity = iVar12;
    }
  }
  iVar1 = (this->m_allocatedbtStridingMeshInterfaceDatas).m_size;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_data[iVar1] = pbVar7;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_size = iVar1 + 1;
  return pbVar7;
}

Assistant:

btStridingMeshInterfaceData* btCollisionWorldImporter::createStridingMeshInterfaceData(btStridingMeshInterfaceData* interfaceData)
{
	//create a new btStridingMeshInterfaceData that is an exact copy of shapedata and store it in the WorldImporter
	btStridingMeshInterfaceData* newData = new btStridingMeshInterfaceData;

	newData->m_scaling = interfaceData->m_scaling;
	newData->m_numMeshParts = interfaceData->m_numMeshParts;
	newData->m_meshPartsPtr = new btMeshPartData[newData->m_numMeshParts];

	for(int i = 0;i < newData->m_numMeshParts;i++)
	{
		btMeshPartData* curPart = &interfaceData->m_meshPartsPtr[i];
		btMeshPartData* curNewPart = &newData->m_meshPartsPtr[i];

		curNewPart->m_numTriangles = curPart->m_numTriangles;
		curNewPart->m_numVertices = curPart->m_numVertices;

		if(curPart->m_vertices3f)
		{
			curNewPart->m_vertices3f = new btVector3FloatData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3f,curPart->m_vertices3f,sizeof(btVector3FloatData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3f = NULL;

		if(curPart->m_vertices3d)
		{
			curNewPart->m_vertices3d = new btVector3DoubleData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3d,curPart->m_vertices3d,sizeof(btVector3DoubleData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3d = NULL;

		int numIndices = curNewPart->m_numTriangles * 3;
		///the m_3indices8 was not initialized in some Bullet versions, this can cause crashes at loading time
		///we catch it by only dealing with m_3indices8 if none of the other indices are initialized
		bool uninitialized3indices8Workaround =false;

		if(curPart->m_indices32)
		{
			uninitialized3indices8Workaround=true;
			curNewPart->m_indices32 = new btIntIndexData[numIndices];
			memcpy(curNewPart->m_indices32,curPart->m_indices32,sizeof(btIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices32 = NULL;

		if(curPart->m_3indices16)
		{
			uninitialized3indices8Workaround=true;
			curNewPart->m_3indices16 = new btShortIntIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices16,curPart->m_3indices16,sizeof(btShortIntIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices16 = NULL;

		if(curPart->m_indices16)
		{
			uninitialized3indices8Workaround=true;
			curNewPart->m_indices16 = new btShortIntIndexData[numIndices];
			memcpy(curNewPart->m_indices16,curPart->m_indices16,sizeof(btShortIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices16 = NULL;

		if(!uninitialized3indices8Workaround && curPart->m_3indices8)
		{
			curNewPart->m_3indices8 = new btCharIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices8,curPart->m_3indices8,sizeof(btCharIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices8 = NULL;

	}

	m_allocatedbtStridingMeshInterfaceDatas.push_back(newData);

	return(newData);
}